

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix4x4.h
# Opt level: O2

bool __thiscall QMatrix4x4::operator==(QMatrix4x4 *this,QMatrix4x4 *other)

{
  float *pfVar1;
  float fVar2;
  
  fVar2 = this->m[0][0];
  if ((((((((fVar2 == other->m[0][0]) && (!NAN(fVar2) && !NAN(other->m[0][0]))) &&
          (fVar2 = this->m[0][1], pfVar1 = other->m[0] + 1, fVar2 == *pfVar1)) &&
         (((!NAN(fVar2) && !NAN(*pfVar1) &&
           (fVar2 = this->m[0][2], pfVar1 = other->m[0] + 2, fVar2 == *pfVar1)) &&
          ((!NAN(fVar2) && !NAN(*pfVar1) &&
           ((fVar2 = this->m[0][3], pfVar1 = other->m[0] + 3, fVar2 == *pfVar1 &&
            (!NAN(fVar2) && !NAN(*pfVar1))))))))) &&
        (fVar2 = this->m[1][0], fVar2 == other->m[1][0])) &&
       (((!NAN(fVar2) && !NAN(other->m[1][0]) &&
         (fVar2 = this->m[1][1], pfVar1 = other->m[1] + 1, fVar2 == *pfVar1)) &&
        (!NAN(fVar2) && !NAN(*pfVar1))))) &&
      (((fVar2 = this->m[1][2], pfVar1 = other->m[1] + 2, fVar2 == *pfVar1 &&
        (!NAN(fVar2) && !NAN(*pfVar1))) &&
       ((fVar2 = this->m[1][3], pfVar1 = other->m[1] + 3, fVar2 == *pfVar1 &&
        ((!NAN(fVar2) && !NAN(*pfVar1) && (fVar2 = this->m[2][0], fVar2 == other->m[2][0])))))))) &&
     (((!NAN(fVar2) && !NAN(other->m[2][0]) &&
       (((((fVar2 = this->m[2][1], pfVar1 = other->m[2] + 1, fVar2 == *pfVar1 &&
           (!NAN(fVar2) && !NAN(*pfVar1))) &&
          (fVar2 = this->m[2][2], pfVar1 = other->m[2] + 2, fVar2 == *pfVar1)) &&
         ((!NAN(fVar2) && !NAN(*pfVar1) &&
          (fVar2 = this->m[2][3], pfVar1 = other->m[2] + 3, fVar2 == *pfVar1)))) &&
        ((!NAN(fVar2) && !NAN(*pfVar1) &&
         ((fVar2 = this->m[3][0], fVar2 == other->m[3][0] && (!NAN(fVar2) && !NAN(other->m[3][0]))))
         ))))) &&
      ((fVar2 = this->m[3][1], pfVar1 = other->m[3] + 1, fVar2 == *pfVar1 &&
       (((!NAN(fVar2) && !NAN(*pfVar1) &&
         (fVar2 = this->m[3][2], pfVar1 = other->m[3] + 2, fVar2 == *pfVar1)) &&
        (!NAN(fVar2) && !NAN(*pfVar1))))))))) {
    return (bool)(-(other->m[3][3] == this->m[3][3]) & 1);
  }
  return false;
}

Assistant:

inline bool QMatrix4x4::operator==(const QMatrix4x4& other) const
{
    return m[0][0] == other.m[0][0] &&
           m[0][1] == other.m[0][1] &&
           m[0][2] == other.m[0][2] &&
           m[0][3] == other.m[0][3] &&
           m[1][0] == other.m[1][0] &&
           m[1][1] == other.m[1][1] &&
           m[1][2] == other.m[1][2] &&
           m[1][3] == other.m[1][3] &&
           m[2][0] == other.m[2][0] &&
           m[2][1] == other.m[2][1] &&
           m[2][2] == other.m[2][2] &&
           m[2][3] == other.m[2][3] &&
           m[3][0] == other.m[3][0] &&
           m[3][1] == other.m[3][1] &&
           m[3][2] == other.m[3][2] &&
           m[3][3] == other.m[3][3];
}